

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon.c
# Opt level: O0

int movemon(void)

{
  monst *pmVar1;
  boolean bVar2;
  int iVar3;
  char local_19;
  boolean somebody_can_move;
  monst *nmtmp;
  monst *mtmp;
  
  local_19 = '\0';
  pmVar1 = level->monlist;
  while (nmtmp = pmVar1, nmtmp != (monst *)0x0) {
    pmVar1 = nmtmp->nmon;
    if ((0 < nmtmp->mhp) && (0xb < nmtmp->movement)) {
      nmtmp->movement = nmtmp->movement + -0xc;
      if (0xb < nmtmp->movement) {
        local_19 = '\x01';
      }
      if (vision_full_recalc != '\0') {
        vision_recalc(0);
      }
      iVar3 = minliquid(nmtmp);
      if (((iVar3 == 0) &&
          (((nmtmp->data->mflags1 & 0x100) == 0 ||
           ((((bVar2 = restrap(nmtmp), bVar2 == '\0' && (nmtmp->m_ap_type != '\x01')) &&
             (nmtmp->m_ap_type != '\x02')) && ((*(uint *)&nmtmp->field_0x60 >> 7 & 1) == 0)))))) &&
         (((((u.uprops[0x15].intrinsic == 0 && (u.uprops[0x15].extrinsic == 0)) ||
            ((*(uint *)&nmtmp->field_0x60 >> 0x1d & 1) != 0)) ||
           (((*(uint *)&nmtmp->field_0x60 >> 0x11 & 1) == 0 ||
            ((viz_array[nmtmp->my][nmtmp->mx] & 1U) == 0)))) ||
          ((iVar3 = dist2((int)nmtmp->mx,(int)nmtmp->my,(int)u.ux,(int)u.uy), 0x40 < iVar3 ||
           (iVar3 = fightm(nmtmp), iVar3 == 0)))))) {
        dochugw(nmtmp);
      }
    }
  }
  bVar2 = any_light_source();
  if (bVar2 != '\0') {
    vision_full_recalc = '\x01';
  }
  dmonsfree(level);
  if (u.utotype != '\0') {
    deferred_goto();
    local_19 = '\0';
  }
  return (int)local_19;
}

Assistant:

int movemon(void)
{
    struct monst *mtmp, *nmtmp;
    boolean somebody_can_move = FALSE;

    /*
    Some of you may remember the former assertion here that
    because of deaths and other actions, a simple one-pass
    algorithm wasn't possible for movemon.  Deaths are no longer
    removed to the separate list fdmon; they are simply left in
    the chain with hit points <= 0, to be cleaned up at the end
    of the pass.

    The only other actions which cause monsters to be removed from
    the chain are level migrations and losedogs().  I believe losedogs()
    is a cleanup routine not associated with monster movements, and
    monsters can only affect level migrations on themselves, not others
    (hence the fetching of nmon before moving the monster).  Currently,
    monsters can jump into traps, read cursed scrolls of teleportation,
    and drink cursed potions of raise level to change levels.  These are
    all reflexive at this point.  Should one monster be able to level
    teleport another, this scheme would have problems.
    */

    for (mtmp = level->monlist; mtmp; mtmp = nmtmp) {
	nmtmp = mtmp->nmon;

	/* Find a monster that we have not treated yet.	 */
	if (DEADMONSTER(mtmp))
	    continue;
	if (mtmp->movement < NORMAL_SPEED)
	    continue;

	mtmp->movement -= NORMAL_SPEED;
	if (mtmp->movement >= NORMAL_SPEED)
	    somebody_can_move = TRUE;

	if (vision_full_recalc) vision_recalc(0);	/* vision! */

	if (minliquid(mtmp)) continue;

	if (is_hider(mtmp->data)) {
	    /* unwatched mimics and piercers may hide again  [MRS] */
	    if (restrap(mtmp))   continue;
	    if (mtmp->m_ap_type == M_AP_FURNITURE ||
				mtmp->m_ap_type == M_AP_OBJECT)
		    continue;
	    if (mtmp->mundetected) continue;
	}

	/* continue if the monster died fighting */
	if (Conflict && !mtmp->iswiz && mtmp->mcansee) {
	    /* Note:
	     *  Conflict does not take effect in the first round.
	     *  Therefore, A monster when stepping into the area will
	     *  get to swing at you.
	     *
	     *  The call to fightm() must be _last_.  The monster might
	     *  have died if it returns 1.
	     */
	    if (couldsee(mtmp->mx,mtmp->my) &&
		(distu(mtmp->mx,mtmp->my) <= BOLT_LIM*BOLT_LIM) &&
							fightm(mtmp))
		continue;	/* mon might have died */
	}
	if (dochugw(mtmp))		/* otherwise just move the monster */
	    continue;
    }

    if (any_light_source())
	vision_full_recalc = 1;	/* in case a mon moved with a light source */
    dmonsfree(level);	/* remove all dead monsters */

    /* a monster may have levteleported player -dlc */
    if (u.utotype) {
	deferred_goto();
	/* changed levels, so these monsters are dormant */
	somebody_can_move = FALSE;
    }

    return somebody_can_move;
}